

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void duckdb::WriteCSVFinalize
               (ClientContext *context,FunctionData *bind_data,GlobalFunctionData *gstate)

{
  Allocator *allocator_p;
  data_ptr_t data;
  idx_t size;
  pointer pFVar1;
  _func_int **pp_Var2;
  GlobalFunctionData *this;
  FunctionData *pFVar3;
  MemoryStream stream;
  MemoryStream local_40;
  
  allocator_p = Allocator::Get(context);
  MemoryStream::MemoryStream(&local_40,allocator_p,0x200);
  pp_Var2 = bind_data[0x71]._vptr_FunctionData;
  if (pp_Var2 == (_func_int **)0x0) {
    if (*(char *)&gstate[8]._vptr_GlobalFunctionData != '\x01') goto LAB_0159f92e;
    pp_Var2 = bind_data[0x8e]._vptr_FunctionData;
    pFVar3 = bind_data + 0x8d;
  }
  else {
    pFVar3 = bind_data + 0x70;
  }
  MemoryStream::WriteData(&local_40,(const_data_ptr_t)pFVar3->_vptr_FunctionData,(idx_t)pp_Var2);
LAB_0159f92e:
  data = MemoryStream::GetData(&local_40);
  size = MemoryStream::GetPosition(&local_40);
  GlobalWriteCSVData::WriteData((GlobalWriteCSVData *)gstate,data,size);
  this = gstate + 7;
  pFVar1 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)this);
  (*pFVar1->_vptr_FileHandle[4])(pFVar1);
  pp_Var2 = this->_vptr_GlobalFunctionData;
  this->_vptr_GlobalFunctionData = (_func_int **)0x0;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 8))();
  }
  MemoryStream::~MemoryStream(&local_40);
  return;
}

Assistant:

void WriteCSVFinalize(ClientContext &context, FunctionData &bind_data, GlobalFunctionData &gstate) {
	auto &global_state = gstate.Cast<GlobalWriteCSVData>();
	auto &csv_data = bind_data.Cast<WriteCSVData>();
	auto &options = csv_data.options;

	MemoryStream stream(Allocator::Get(context));
	if (!options.suffix.empty()) {
		stream.WriteData(const_data_ptr_cast(options.suffix.c_str()), options.suffix.size());
	} else if (global_state.written_anything) {
		stream.WriteData(const_data_ptr_cast(csv_data.newline.c_str()), csv_data.newline.size());
	}
	global_state.WriteData(stream.GetData(), stream.GetPosition());

	global_state.handle->Close();
	global_state.handle.reset();
}